

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O1

int __thiscall ncnn::Pooling1D::load_param(Pooling1D *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->pooling_type = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar1;
  iVar1 = ParamDict::get(pd,2,1);
  this->stride_w = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->pad_left = iVar1;
  iVar1 = ParamDict::get(pd,0xe,iVar1);
  this->pad_right = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->global_pooling = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->pad_mode = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->avgpool_count_include_pad = iVar1;
  iVar1 = ParamDict::get(pd,7,0);
  this->adaptive_pooling = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->out_w = iVar1;
  return 0;
}

Assistant:

int Pooling1D::load_param(const ParamDict& pd)
{
    pooling_type = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    stride_w = pd.get(2, 1);
    pad_left = pd.get(3, 0);
    pad_right = pd.get(14, pad_left);
    global_pooling = pd.get(4, 0);
    pad_mode = pd.get(5, 0);
    avgpool_count_include_pad = pd.get(6, 0);
    adaptive_pooling = pd.get(7, 0);
    out_w = pd.get(8, 0);

    return 0;
}